

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O0

ply_type __thiscall
gvr::PLYReader::getTypeOfProperty(PLYReader *this,string *elem_name,string *prop_name)

{
  PLYElement *pPVar1;
  PLYProperty *this_00;
  string *in_RSI;
  PLYReader *in_RDI;
  PLYProperty *prop;
  PLYElement *elem;
  ply_type local_4;
  
  pPVar1 = findElement(in_RDI,in_RSI);
  if ((pPVar1 == (PLYElement *)0x0) ||
     (this_00 = PLYElement::findProperty((PLYElement *)in_RDI,in_RSI), this_00 == (PLYProperty *)0x0
     )) {
    local_4 = ply_none;
  }
  else {
    local_4 = anon_unknown_3::PLYProperty::getValueType(this_00);
  }
  return local_4;
}

Assistant:

ply_type PLYReader::getTypeOfProperty(const std::string &elem_name,
                                      const std::string &prop_name) const
{
  PLYElement *elem=findElement(elem_name);

  if (elem != 0)
  {
    PLYProperty *prop=elem->findProperty(prop_name);

    if (prop != 0)
    {
      return prop->getValueType();
    }
  }

  return ply_none;
}